

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::absolute(Path *__return_storage_ptr__,Path *this,Path *base)

{
  Path *this_00;
  bool bVar1;
  string local_70 [48];
  string local_40 [32];
  Path *local_20;
  Path *base_local;
  Path *this_local;
  
  local_20 = base;
  base_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = is_absolute(this);
  this_00 = local_20;
  if (bVar1) {
    std::__cxx11::string::string(local_40,(string *)this);
    Path(__return_storage_ptr__,(string *)local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    std::__cxx11::string::string(local_70,(string *)this);
    join(__return_storage_ptr__,this_00,(string *)local_70);
    std::__cxx11::string::~string(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::absolute(const Path& base /* = Path::pwd() */) const
{
  if (is_absolute())
    return Path(m_path);
  else
    return base.join(m_path);
}